

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

void __thiscall QHostInfoLookupManager::rescheduleWithMutexHeld(QHostInfoLookupManager *this)

{
  QList<QHostInfoRunnable_*> *this_00;
  QQueue<QHostInfoRunnable_*> *this_01;
  long lVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  uint uVar7;
  int iVar8;
  P _b;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 local_48 [8];
  anon_class_8_1_54a39814_for__M_pred_conflict local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  if (this->wasDeleted == false) {
    if ((this->finishedLookups).d.size != 0) {
      if ((this->finishedLookups).d.size != 0) {
        uVar9 = 0;
        do {
          local_48._0_4_ = (this->finishedLookups).d.ptr[uVar9]->id;
          local_40.t = (int *)local_48;
          QtPrivate::
          sequential_erase_if<QList<int>,QtPrivate::sequential_erase<QList<int>,int>(QList<int>&,int_const&)::_lambda(auto:1_const&)_1_>
                    (&this->abortedLookups,&local_40);
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)(this->finishedLookups).d.size);
      }
      QList<QHostInfoRunnable_*>::clear(&this->finishedLookups);
    }
    this_00 = &this->postponedLookups;
    iVar4 = QList<QHostInfoRunnable_*>::begin(this_00);
    iVar5 = QList<QHostInfoRunnable_*>::end(this_00);
    iVar6 = QList<QHostInfoRunnable_*>::begin(this_00);
    this_01 = &this->scheduledLookups;
    local_48 = (undefined1  [8])this;
    if (iVar4.i != iVar5.i) {
      do {
        bVar2 = rescheduleWithMutexHeld::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)local_48,*iVar4.i);
        if (bVar2) {
          *iVar6.i = *iVar4.i;
          iVar6.i = iVar6.i + 1;
        }
        else {
          local_40.t = (int *)*iVar4.i;
          QtPrivate::QPodArrayOps<QHostInfoRunnable*>::emplace<QHostInfoRunnable*&>
                    ((QPodArrayOps<QHostInfoRunnable*> *)this_01,0,(QHostInfoRunnable **)&local_40);
        }
        iVar4.i = iVar4.i + 1;
      } while (iVar4.i != iVar5.i);
    }
    iVar4 = QList<QHostInfoRunnable_*>::end(this_00);
    QList<QHostInfoRunnable_*>::erase(this_00,(const_iterator)iVar6.i,(const_iterator)iVar4.i);
    iVar4 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
    iVar5 = QList<QHostInfoRunnable_*>::end(&this_01->super_QList<QHostInfoRunnable_*>);
    iVar6 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
    local_48 = (undefined1  [8])this;
    if (iVar4.i != iVar5.i) {
      do {
        bVar2 = rescheduleWithMutexHeld::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)local_48,*iVar4.i);
        if (bVar2) {
          local_40.t = (int *)*iVar4.i;
          QtPrivate::QPodArrayOps<QHostInfoRunnable*>::emplace<QHostInfoRunnable*&>
                    ((QPodArrayOps<QHostInfoRunnable*> *)this_00,(this->postponedLookups).d.size,
                     (QHostInfoRunnable **)&local_40);
          QList<QHostInfoRunnable_*>::end(this_00);
        }
        else {
          *iVar6.i = *iVar4.i;
          iVar6.i = iVar6.i + 1;
        }
        iVar4.i = iVar4.i + 1;
      } while (iVar4.i != iVar5.i);
    }
    iVar4 = QList<QHostInfoRunnable_*>::end(&this_01->super_QList<QHostInfoRunnable_*>);
    QList<QHostInfoRunnable_*>::erase
              (&this_01->super_QList<QHostInfoRunnable_*>,(const_iterator)iVar6.i,
               (const_iterator)iVar4.i);
    iVar3 = QThreadPool::maxThreadCount();
    iVar8 = 1;
    if (1 < iVar3) {
      iVar8 = iVar3;
    }
    uVar7 = iVar8 - (int)(this->currentLookups).d.size;
    if (0 < (int)uVar7) {
      lVar1 = (this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.size;
      iVar4 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
      if (lVar1 != 0) {
        if (lVar1 < (long)(ulong)uVar7) {
          uVar7 = (uint)lVar1;
        }
        iVar8 = -uVar7;
        do {
          QThreadPool::start((QRunnable *)&this->threadPool,(int)*iVar4.i);
          local_40.t = (int *)*iVar4.i;
          QtPrivate::QPodArrayOps<QHostInfoRunnable*>::emplace<QHostInfoRunnable*&>
                    ((QPodArrayOps<QHostInfoRunnable*> *)&this->currentLookups,
                     (this->currentLookups).d.size,(QHostInfoRunnable **)&local_40);
          QList<QHostInfoRunnable_*>::end(&this->currentLookups);
          iVar4.i = iVar4.i + 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 0);
      }
      iVar5 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
      QList<QHostInfoRunnable_*>::erase
                (&this_01->super_QList<QHostInfoRunnable_*>,(const_iterator)iVar5.i,
                 (const_iterator)iVar4.i);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoLookupManager::rescheduleWithMutexHeld()
{
    if (wasDeleted)
        return;

    // goals of this function:
    //  - launch new lookups via the thread pool
    //  - make sure only one lookup per host/IP is in progress

    if (!finishedLookups.isEmpty()) {
        // remove ID from aborted if it is in there
        for (int i = 0; i < finishedLookups.size(); i++) {
           abortedLookups.removeAll(finishedLookups.at(i)->id);
        }

        finishedLookups.clear();
    }

#if QT_CONFIG(thread)
    auto isAlreadyRunning = [this](QHostInfoRunnable *lookup) {
        return std::any_of(currentLookups.cbegin(), currentLookups.cend(), ToBeLookedUpEquals(lookup->toBeLookedUp));
    };

    // Transfer any postponed lookups that aren't currently running to the scheduled list, keeping already-running lookups:
    postponedLookups.erase(separate_if(postponedLookups.begin(),
                                       postponedLookups.end(),
                                       postponedLookups.begin(),
                                       std::front_inserter(scheduledLookups), // prepend! we want to finish it ASAP
                                       isAlreadyRunning).first,
                           postponedLookups.end());

    // Unschedule and postpone any that are currently running:
    scheduledLookups.erase(separate_if(scheduledLookups.begin(),
                                       scheduledLookups.end(),
                                       std::back_inserter(postponedLookups),
                                       scheduledLookups.begin(),
                                       isAlreadyRunning).second,
                           scheduledLookups.end());

    const int availableThreads = std::max(threadPool.maxThreadCount(), 1) - currentLookups.size();
    if (availableThreads > 0) {
        int readyToStartCount = qMin(availableThreads, scheduledLookups.size());
        auto it = scheduledLookups.begin();
        while (readyToStartCount--) {
            // runnable now running in new thread, track this in currentLookups
            threadPool.start(*it);
            currentLookups.push_back(std::move(*it));
            ++it;
        }
        scheduledLookups.erase(scheduledLookups.begin(), it);
    }
#else
    if (!scheduledLookups.isEmpty())
        scheduledLookups.takeFirst()->run();
#endif
}